

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O3

int __thiscall fmt::v5::file::pipe(file *this,int *__pipedes)

{
  int iVar1;
  int extraout_EAX;
  system_error *this_00;
  int *piVar2;
  int __fd;
  string_view message;
  int fds [2];
  file local_24;
  int local_20 [2];
  
  piVar2 = __pipedes;
  close(this,(int)__pipedes);
  __fd = (int)piVar2;
  close((file *)__pipedes,__fd);
  local_20[0] = 0;
  local_20[1] = 0;
  iVar1 = ::pipe(local_20);
  if (iVar1 == 0) {
    iVar1 = local_20[0];
    local_24.fd_ = local_20[0];
    close(this,__fd);
    this->fd_ = iVar1;
    local_24.fd_ = -1;
    ~file(&local_24);
    iVar1 = local_20[1];
    local_24.fd_ = local_20[1];
    close((file *)__pipedes,__fd);
    *__pipedes = iVar1;
    local_24.fd_ = -1;
    ~file(&local_24);
    return extraout_EAX;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x12;
  message.data_ = "cannot create pipe";
  system_error::system_error<>(this_00,*piVar2,message);
  __cxa_throw(this_00,&system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void file::pipe(file &read_end, file &write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#endif
  if (result != 0)
    FMT_THROW(system_error(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = file(fds[0]);
  write_end = file(fds[1]);
}